

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void init_gop_frames_for_tpl
               (AV1_COMP *cpi,EncodeFrameParams *init_frame_params,GF_GROUP *gf_group,
               int *tpl_group_frames,int *pframe_qindex)

{
  int iVar1;
  int index;
  int refresh_frame_flags;
  int iVar2;
  int iVar3;
  long lVar4;
  lookahead_entry *plVar5;
  int *in_RCX;
  GF_GROUP *in_RDX;
  void *in_RSI;
  long *in_RDI;
  int *in_R8;
  int i_2;
  int refresh_frame_map_index_1;
  int refresh_mask_1;
  int true_disp_1;
  lookahead_entry *buf_1;
  int lookahead_index_1;
  FRAME_UPDATE_TYPE frame_update_type_1;
  TplDepFrame *tpl_frame_1;
  int frame_display_index;
  int extend_frame_length;
  int extend_frame_count;
  int tpl_extend;
  int i_1;
  int refresh_frame_map_index;
  int refresh_mask;
  int true_disp;
  YV12_BUFFER_CONFIG *tf_buf;
  FRAME_DIFF frame_diff;
  lookahead_entry *buf;
  int lookahead_index;
  FRAME_UPDATE_TYPE frame_update_type;
  TplDepFrame *tpl_frame;
  int gop_length;
  int process_frame_count;
  int gf_index;
  int i;
  int ref_picture_map [8];
  TplParams *tpl_data;
  EncodeFrameParams frame_params;
  int remapped_ref_idx [8];
  RefFrameMapPair ref_frame_map_pairs [8];
  AV1_COMMON *cm;
  int local_1b4;
  int local_1ac;
  int local_1a8;
  bool local_1a2;
  bool local_1a1;
  int local_1a0;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  AV1_COMP *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  int local_170;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  FRAME_UPDATE_TYPE frame_update_type_00;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  AV1_COMP *in_stack_fffffffffffffea8;
  FRAME_DIFF local_150;
  lookahead_entry *local_140;
  int local_138;
  FRAME_UPDATE_TYPE local_131;
  long local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int aiStack_118 [10];
  long local_f0;
  undefined1 local_e4 [4];
  FRAME_TYPE local_e0;
  uint local_d4;
  uint local_cc;
  int *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  AV1_COMP *in_stack_ffffffffffffff60;
  int local_98;
  int in_stack_ffffffffffffff6c;
  RefFrameMapPair *in_stack_ffffffffffffff70;
  int local_78 [18];
  long *local_30;
  int *local_28;
  int *local_20;
  GF_GROUP *local_18;
  void *local_10;
  long *local_8;
  
  local_30 = in_RDI + 0x77f0;
  *in_R8 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  init_ref_map_pair(in_stack_fffffffffffffe70,
                    (RefFrameMapPair *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                   );
  memcpy(local_e4,local_10,0x4c);
  lVar4 = *local_8;
  local_f0 = lVar4 + 0xd2a8;
  for (local_11c = 0; local_11c < 8; local_11c = local_11c + 1) {
    if (local_e0 == '\0') {
      *(undefined8 *)(*(long *)(lVar4 + 0x12298) + (long)(-1 - local_11c) * 0x60 + 0x10) = 0;
      *(undefined8 *)(*(long *)(lVar4 + 0x12298) + (long)(-1 - local_11c) * 0x60 + 0x18) = 0;
      *(undefined4 *)(*(long *)(lVar4 + 0x12298) + (long)(-1 - local_11c) * 0x60 + 0x58) = 0;
    }
    else {
      *(long *)(*(long *)(lVar4 + 0x12298) + (long)(-1 - local_11c) * 0x60 + 0x10) =
           local_30[(long)local_11c + 0x34] + 0x4e0;
      *(long *)(*(long *)(lVar4 + 0x12298) + (long)(-1 - local_11c) * 0x60 + 0x18) =
           local_30[(long)local_11c + 0x34] + 0x4e0;
      *(undefined4 *)(*(long *)(lVar4 + 0x12298) + (long)(-1 - local_11c) * 0x60 + 0x58) =
           *(undefined4 *)(local_30[(long)local_11c + 0x34] + 0x24);
    }
    aiStack_118[local_11c] = -1 - local_11c;
  }
  *local_20 = 0;
  local_124 = 0;
  local_128 = get_gop_length(local_18);
  for (local_120 = 0; local_120 < local_128; local_120 = local_120 + 1) {
    local_130 = *(long *)(local_f0 + 0x4ff0) + (long)local_120 * 0x60;
    local_131 = local_18->update_type[local_120];
    local_138 = (uint)local_18->cur_frame_idx[local_120] + (uint)local_18->arf_src_offset[local_120]
    ;
    local_1a1 = local_131 != '\x03' && local_131 != '\x06';
    local_d4 = (uint)local_1a1;
    local_1a2 = local_131 == '\x05' || local_131 == '\x04';
    local_cc = (uint)local_1a2;
    local_e0 = local_18->frame_type[local_120];
    if (local_131 == '\x01') {
      *local_28 = local_18->q_val[local_120];
    }
    local_140 = av1_lookahead_peek(*(lookahead_ctx **)(*local_8 + 0x170),local_138,
                                   (COMPRESSOR_STAGE)local_8[0x13a98]);
    frame_update_type_00 = (FRAME_UPDATE_TYPE)((uint)in_stack_fffffffffffffe9c >> 0x18);
    if (local_140 == (lookahead_entry *)0x0) break;
    *(lookahead_entry **)(local_130 + 0x10) = local_140;
    in_stack_fffffffffffffea8 =
         (AV1_COMP *)
         av1_tf_info_get_filtered_buf
                   ((TEMPORAL_FILTER_INFO *)(*local_8 + 0xbd08),local_120,&local_150);
    if (in_stack_fffffffffffffea8 != (AV1_COMP *)0x0) {
      *(AV1_COMP **)(local_130 + 0x10) = in_stack_fffffffffffffea8;
    }
    *(int *)(local_130 + 0x58) = local_138 + (int)local_30[2];
    if ((local_131 != '\x04') && (local_131 != '\x05')) {
      *(long *)(local_130 + 0x18) = local_f0 + 0x28f0 + (long)local_124 * 0xd0;
      *(undefined8 *)(local_130 + 8) = *(undefined8 *)(local_f0 + 0x2768 + (long)local_124 * 8);
      local_124 = local_124 + 1;
    }
    in_stack_fffffffffffffea4 = *(int *)(local_130 + 0x58);
    av1_get_ref_frames(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60
                       ,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                       in_stack_ffffffffffffff50);
    in_stack_fffffffffffffea0 =
         av1_get_refresh_frame_flags
                   (in_stack_fffffffffffffea8,
                    (EncodeFrameParams *)
                    CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                    frame_update_type_00,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                    (RefFrameMapPair *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                   );
    if ((*(byte *)(*local_8 + 0x3564 + (long)local_120) & 1) != 0) {
      in_stack_fffffffffffffea0 = 0;
    }
    in_stack_fffffffffffffe9c = av1_get_refresh_ref_frame_map(in_stack_fffffffffffffea0);
    if ((in_stack_fffffffffffffe9c < 8) && (in_stack_fffffffffffffe9c != -1)) {
      local_1a8 = in_stack_fffffffffffffea4;
      if (in_stack_fffffffffffffea4 < 0) {
        local_1a8 = 0;
      }
      local_78[(long)in_stack_fffffffffffffe9c * 2 + 1] = local_1a8;
      iVar1 = get_true_pyr_level(local_18->layer_depth[local_120],in_stack_fffffffffffffea4,
                                 *(int *)(*local_8 + 0xc50));
      local_78[(long)in_stack_fffffffffffffe9c * 2] = iVar1;
    }
    for (in_stack_fffffffffffffe98 = 1; in_stack_fffffffffffffe98 < 8;
        in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 + 1) {
      *(int *)(local_130 + 0x20 + (long)(in_stack_fffffffffffffe98 + -1) * 4) =
           aiStack_118[(&local_98)[in_stack_fffffffffffffe98 + -1]];
    }
    if (in_stack_fffffffffffffea0 != 0) {
      aiStack_118[in_stack_fffffffffffffe9c] = local_120;
    }
    *local_20 = *local_20 + 1;
  }
  iVar1 = (int)local_8[0x848a] + -0x20;
  local_170 = 0;
  local_1ac = iVar1;
  if (*(int *)((long)local_8 + 0x6079c) - *(int *)(*local_8 + 0xac60) <= iVar1) {
    local_1ac = *(int *)((long)local_8 + 0x6079c) - *(int *)(*local_8 + 0xac60);
  }
  index = (uint)local_18->cur_frame_idx[local_128 + -1] +
          (uint)local_18->arf_src_offset[local_128 + -1];
  while( true ) {
    index = index + 1;
    if (0x5f < local_120 || local_1ac <= local_170) {
      return;
    }
    lVar4 = *(long *)(local_f0 + 0x4ff0) + (long)local_120 * 0x60;
    local_d4 = 1;
    local_cc = 0;
    local_e0 = 1;
    plVar5 = av1_lookahead_peek(*(lookahead_ctx **)(*local_8 + 0x170),index,
                                (COMPRESSOR_STAGE)local_8[0x13a98]);
    if (plVar5 == (lookahead_entry *)0x0) break;
    *(lookahead_entry **)(lVar4 + 0x10) = plVar5;
    *(long *)(lVar4 + 0x18) = local_f0 + 0x28f0 + (long)local_124 * 0xd0;
    *(undefined8 *)(lVar4 + 8) = *(undefined8 *)(local_f0 + 0x2768 + (long)local_124 * 8);
    *(int *)(lVar4 + 0x58) = index + (int)local_30[2];
    local_124 = local_124 + 1;
    local_18->update_type[local_120] = '\x01';
    local_18->q_val[local_120] = *local_28;
    iVar3 = *(int *)(lVar4 + 0x58);
    av1_get_ref_frames(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60
                       ,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                       in_stack_ffffffffffffff50);
    refresh_frame_flags =
         av1_get_refresh_frame_flags
                   (in_stack_fffffffffffffea8,
                    (EncodeFrameParams *)
                    CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                    (FRAME_UPDATE_TYPE)((uint)in_stack_fffffffffffffe9c >> 0x18),
                    in_stack_fffffffffffffe98,iVar1,(RefFrameMapPair *)CONCAT44(local_1ac,index));
    iVar2 = av1_get_refresh_ref_frame_map(refresh_frame_flags);
    if ((iVar2 < 8) && (iVar2 != -1)) {
      local_1b4 = iVar3;
      if (iVar3 < 0) {
        local_1b4 = 0;
      }
      local_78[(long)iVar2 * 2 + 1] = local_1b4;
      iVar3 = get_true_pyr_level(local_18->layer_depth[local_120],iVar3,*(int *)(*local_8 + 0xc50));
      local_78[(long)iVar2 * 2] = iVar3;
    }
    for (local_1a0 = 1; local_1a0 < 8; local_1a0 = local_1a0 + 1) {
      *(int *)(lVar4 + 0x20 + (long)(local_1a0 + -1) * 4) = aiStack_118[(&local_98)[local_1a0 + -1]]
      ;
    }
    *(undefined4 *)(lVar4 + 0x38) = 0xffffffff;
    *(undefined4 *)(lVar4 + 0x28) = 0xffffffff;
    *(undefined4 *)(lVar4 + 0x30) = 0xffffffff;
    *(undefined4 *)(lVar4 + 0x34) = 0xffffffff;
    if (refresh_frame_flags != 0) {
      aiStack_118[iVar2] = local_120;
    }
    *local_20 = *local_20 + 1;
    local_170 = local_170 + 1;
    local_120 = local_120 + 1;
  }
  return;
}

Assistant:

static inline void init_gop_frames_for_tpl(
    AV1_COMP *cpi, const EncodeFrameParams *const init_frame_params,
    GF_GROUP *gf_group, int *tpl_group_frames, int *pframe_qindex) {
  AV1_COMMON *cm = &cpi->common;
  assert(cpi->gf_frame_index == 0);
  *pframe_qindex = 0;

  RefFrameMapPair ref_frame_map_pairs[REF_FRAMES];
  init_ref_map_pair(cpi, ref_frame_map_pairs);

  int remapped_ref_idx[REF_FRAMES];

  EncodeFrameParams frame_params = *init_frame_params;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;

  int ref_picture_map[REF_FRAMES];

  for (int i = 0; i < REF_FRAMES; ++i) {
    if (frame_params.frame_type == KEY_FRAME) {
      tpl_data->tpl_frame[-i - 1].gf_picture = NULL;
      tpl_data->tpl_frame[-i - 1].rec_picture = NULL;
      tpl_data->tpl_frame[-i - 1].frame_display_index = 0;
    } else {
      tpl_data->tpl_frame[-i - 1].gf_picture = &cm->ref_frame_map[i]->buf;
      tpl_data->tpl_frame[-i - 1].rec_picture = &cm->ref_frame_map[i]->buf;
      tpl_data->tpl_frame[-i - 1].frame_display_index =
          cm->ref_frame_map[i]->display_order_hint;
    }

    ref_picture_map[i] = -i - 1;
  }

  *tpl_group_frames = 0;

  int gf_index;
  int process_frame_count = 0;
  const int gop_length = get_gop_length(gf_group);

  for (gf_index = 0; gf_index < gop_length; ++gf_index) {
    TplDepFrame *tpl_frame = &tpl_data->tpl_frame[gf_index];
    FRAME_UPDATE_TYPE frame_update_type = gf_group->update_type[gf_index];
    int lookahead_index =
        gf_group->cur_frame_idx[gf_index] + gf_group->arf_src_offset[gf_index];
    frame_params.show_frame = frame_update_type != ARF_UPDATE &&
                              frame_update_type != INTNL_ARF_UPDATE;
    frame_params.show_existing_frame =
        frame_update_type == INTNL_OVERLAY_UPDATE ||
        frame_update_type == OVERLAY_UPDATE;
    frame_params.frame_type = gf_group->frame_type[gf_index];

    if (frame_update_type == LF_UPDATE)
      *pframe_qindex = gf_group->q_val[gf_index];

    const struct lookahead_entry *buf = av1_lookahead_peek(
        cpi->ppi->lookahead, lookahead_index, cpi->compressor_stage);
    if (buf == NULL) break;
    tpl_frame->gf_picture = &buf->img;

    // Use filtered frame buffer if available. This will make tpl stats more
    // precise.
    FRAME_DIFF frame_diff;
    const YV12_BUFFER_CONFIG *tf_buf =
        av1_tf_info_get_filtered_buf(&cpi->ppi->tf_info, gf_index, &frame_diff);
    if (tf_buf != NULL) {
      tpl_frame->gf_picture = tf_buf;
    }

    // 'cm->current_frame.frame_number' is the display number
    // of the current frame.
    // 'lookahead_index' is frame offset within the gf group.
    // 'lookahead_index + cm->current_frame.frame_number'
    // is the display index of the frame.
    tpl_frame->frame_display_index =
        lookahead_index + cm->current_frame.frame_number;
    assert(buf->display_idx ==
           cpi->frame_index_set.show_frame_count + lookahead_index);

    if (frame_update_type != OVERLAY_UPDATE &&
        frame_update_type != INTNL_OVERLAY_UPDATE) {
      tpl_frame->rec_picture = &tpl_data->tpl_rec_pool[process_frame_count];
      tpl_frame->tpl_stats_ptr = tpl_data->tpl_stats_pool[process_frame_count];
      ++process_frame_count;
    }
    const int true_disp = (int)(tpl_frame->frame_display_index);

    av1_get_ref_frames(ref_frame_map_pairs, true_disp, cpi, gf_index, 0,
                       remapped_ref_idx);

    int refresh_mask =
        av1_get_refresh_frame_flags(cpi, &frame_params, frame_update_type,
                                    gf_index, true_disp, ref_frame_map_pairs);

    // Make the frames marked as is_frame_non_ref to non-reference frames.
    if (cpi->ppi->gf_group.is_frame_non_ref[gf_index]) refresh_mask = 0;

    int refresh_frame_map_index = av1_get_refresh_ref_frame_map(refresh_mask);

    if (refresh_frame_map_index < REF_FRAMES &&
        refresh_frame_map_index != INVALID_IDX) {
      ref_frame_map_pairs[refresh_frame_map_index].disp_order =
          AOMMAX(0, true_disp);
      ref_frame_map_pairs[refresh_frame_map_index].pyr_level =
          get_true_pyr_level(gf_group->layer_depth[gf_index], true_disp,
                             cpi->ppi->gf_group.max_layer_depth);
    }

    for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i)
      tpl_frame->ref_map_index[i - LAST_FRAME] =
          ref_picture_map[remapped_ref_idx[i - LAST_FRAME]];

    if (refresh_mask) ref_picture_map[refresh_frame_map_index] = gf_index;

    ++*tpl_group_frames;
  }

  const int tpl_extend = cpi->oxcf.gf_cfg.lag_in_frames - MAX_GF_INTERVAL;
  int extend_frame_count = 0;
  int extend_frame_length = AOMMIN(
      tpl_extend, cpi->rc.frames_to_key - cpi->ppi->p_rc.baseline_gf_interval);

  int frame_display_index = gf_group->cur_frame_idx[gop_length - 1] +
                            gf_group->arf_src_offset[gop_length - 1] + 1;

  for (;
       gf_index < MAX_TPL_FRAME_IDX && extend_frame_count < extend_frame_length;
       ++gf_index) {
    TplDepFrame *tpl_frame = &tpl_data->tpl_frame[gf_index];
    FRAME_UPDATE_TYPE frame_update_type = LF_UPDATE;
    frame_params.show_frame = frame_update_type != ARF_UPDATE &&
                              frame_update_type != INTNL_ARF_UPDATE;
    frame_params.show_existing_frame =
        frame_update_type == INTNL_OVERLAY_UPDATE;
    frame_params.frame_type = INTER_FRAME;

    int lookahead_index = frame_display_index;
    struct lookahead_entry *buf = av1_lookahead_peek(
        cpi->ppi->lookahead, lookahead_index, cpi->compressor_stage);

    if (buf == NULL) break;

    tpl_frame->gf_picture = &buf->img;
    tpl_frame->rec_picture = &tpl_data->tpl_rec_pool[process_frame_count];
    tpl_frame->tpl_stats_ptr = tpl_data->tpl_stats_pool[process_frame_count];
    // 'cm->current_frame.frame_number' is the display number
    // of the current frame.
    // 'frame_display_index' is frame offset within the gf group.
    // 'frame_display_index + cm->current_frame.frame_number'
    // is the display index of the frame.
    tpl_frame->frame_display_index =
        frame_display_index + cm->current_frame.frame_number;

    ++process_frame_count;

    gf_group->update_type[gf_index] = LF_UPDATE;

#if CONFIG_BITRATE_ACCURACY && CONFIG_THREE_PASS
    if (cpi->oxcf.pass == AOM_RC_SECOND_PASS) {
      if (cpi->oxcf.rc_cfg.mode == AOM_Q) {
        *pframe_qindex = cpi->oxcf.rc_cfg.cq_level;
      } else if (cpi->oxcf.rc_cfg.mode == AOM_VBR) {
        // TODO(angiebird): Find a more adaptive method to decide pframe_qindex
        // override the pframe_qindex in the second pass when bitrate accuracy
        // is on. We found that setting this pframe_qindex make the tpl stats
        // more stable.
        *pframe_qindex = 128;
      }
    }
#endif  // CONFIG_BITRATE_ACCURACY && CONFIG_THREE_PASS
    gf_group->q_val[gf_index] = *pframe_qindex;
    const int true_disp = (int)(tpl_frame->frame_display_index);
    av1_get_ref_frames(ref_frame_map_pairs, true_disp, cpi, gf_index, 0,
                       remapped_ref_idx);
    int refresh_mask =
        av1_get_refresh_frame_flags(cpi, &frame_params, frame_update_type,
                                    gf_index, true_disp, ref_frame_map_pairs);
    int refresh_frame_map_index = av1_get_refresh_ref_frame_map(refresh_mask);

    if (refresh_frame_map_index < REF_FRAMES &&
        refresh_frame_map_index != INVALID_IDX) {
      ref_frame_map_pairs[refresh_frame_map_index].disp_order =
          AOMMAX(0, true_disp);
      ref_frame_map_pairs[refresh_frame_map_index].pyr_level =
          get_true_pyr_level(gf_group->layer_depth[gf_index], true_disp,
                             cpi->ppi->gf_group.max_layer_depth);
    }

    for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i)
      tpl_frame->ref_map_index[i - LAST_FRAME] =
          ref_picture_map[remapped_ref_idx[i - LAST_FRAME]];

    tpl_frame->ref_map_index[ALTREF_FRAME - LAST_FRAME] = -1;
    tpl_frame->ref_map_index[LAST3_FRAME - LAST_FRAME] = -1;
    tpl_frame->ref_map_index[BWDREF_FRAME - LAST_FRAME] = -1;
    tpl_frame->ref_map_index[ALTREF2_FRAME - LAST_FRAME] = -1;

    if (refresh_mask) ref_picture_map[refresh_frame_map_index] = gf_index;

    ++*tpl_group_frames;
    ++extend_frame_count;
    ++frame_display_index;
  }
}